

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_gallocr_free(ggml_gallocr_t galloc)

{
  bool bVar1;
  undefined8 *in_RDI;
  int j_1;
  _Bool freed_1;
  int j;
  _Bool freed;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_14;
  int local_c;
  
  if (in_RDI != (undefined8 *)0x0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 3); local_c = local_c + 1) {
      if (in_RDI[1] != 0) {
        bVar1 = false;
        for (local_14 = 0; local_14 < local_c; local_14 = local_14 + 1) {
          if (*(long *)(in_RDI[1] + (long)local_14 * 8) == *(long *)(in_RDI[1] + (long)local_c * 8))
          {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          ggml_backend_buffer_free
                    ((ggml_backend_buffer_t)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        }
      }
      if (in_RDI[2] != 0) {
        bVar1 = false;
        for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < local_c;
            in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
          if (*(long *)(in_RDI[2] + (long)in_stack_ffffffffffffffe4 * 8) ==
              *(long *)(in_RDI[2] + (long)local_c * 8)) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          ggml_dyn_tallocr_free((ggml_dyn_tallocr *)0x15b20c);
        }
      }
    }
    ggml_hash_set_free((ggml_hash_set *)0x15b22e);
    free((void *)in_RDI[7]);
    free((void *)*in_RDI);
    free((void *)in_RDI[1]);
    free((void *)in_RDI[2]);
    free((void *)in_RDI[8]);
    free((void *)in_RDI[10]);
    free(in_RDI);
  }
  return;
}

Assistant:

void ggml_gallocr_free(ggml_gallocr_t galloc) {
    if (galloc == NULL) {
        return;
    }

    for (int i = 0; i < galloc->n_buffers; i++) {
        if (galloc->buffers != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buffers[j] == galloc->buffers[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_backend_buffer_free(galloc->buffers[i]);
            }
        }
        if (galloc->buf_tallocs != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_dyn_tallocr_free(galloc->buf_tallocs[i]);
            }
        }
    }

    ggml_hash_set_free(&galloc->hash_set);
    free(galloc->hash_values);
    free(galloc->bufts);
    free(galloc->buffers);
    free(galloc->buf_tallocs);
    free(galloc->node_allocs);
    free(galloc->leaf_allocs);
    free(galloc);
}